

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::IFF_PDU::Encode(IFF_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  reference this_00;
  LayerHeader *pLVar3;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  IFF_PDU *this_local;
  
  Header7::Encode(&this->super_Header,stream);
  pKVar2 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_EmittingEntityID);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,(DataTypeBase *)&this->m_EventID);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_Location).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_SystemID).super_DataTypeBase);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8SystemDesignator);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8SystemSpecific);
  DATA_TYPE::operator<<(pKVar2,&(this->m_FOD).super_DataTypeBase);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
            ::begin(&this->m_vLayers);
  local_28._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::LayerHeader> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
       ::end(&this->m_vLayers);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>_>
              ::operator*(&citrEnd);
    pLVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>::operator->(this_00);
    (*(pLVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pLVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void IFF_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_EmittingEntityID
           << KDIS_STREAM m_EventID
           << KDIS_STREAM m_Location
           << KDIS_STREAM m_SystemID
           << m_ui8SystemDesignator
		   << m_ui8SystemSpecific
           << KDIS_STREAM m_FOD;

	vector<LyrHdrPtr>::const_iterator citr = m_vLayers.begin();
	vector<LyrHdrPtr>::const_iterator citrEnd = m_vLayers.end();
	for( ; citr != citrEnd; ++citr )
	{
		( *citr )->Encode( stream );
	}
}